

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O1

void __thiscall ResolverThread::stop(ResolverThread *this)

{
  char *__end;
  _Any_data local_88;
  code *local_78;
  undefined8 uStack_70;
  string local_60;
  string local_40;
  
  LOCK();
  (this->keep_running)._M_base._M_i = false;
  UNLOCK();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"","");
  local_78 = (code *)0x0;
  uStack_70 = 0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  resolve(this,&local_40,&local_60,(EventLoop *)0x0,(ResolverHandler *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ResolverThread::stop() {
    keep_running = false;
    resolve("", "", nullptr, nullptr);
}